

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O1

int __thiscall pbrt::Sampler::writeTo(Sampler *this,BinaryWriter *binary)

{
  int samplerType;
  undefined1 local_14 [4];
  
  BinaryWriter::writeRaw(binary,local_14,4);
  BinaryWriter::writeRaw(binary,&this->pixelSamples,4);
  BinaryWriter::writeRaw(binary,&this->xSamples,4);
  BinaryWriter::writeRaw(binary,&this->ySamples,4);
  return 8;
}

Assistant:

int Sampler::writeTo(BinaryWriter &binary) {
      int samplerType = static_cast<int>(type);
      binary.write(samplerType);
      binary.write(pixelSamples);
      binary.write(xSamples);
      binary.write(ySamples);
      return TYPE_SAMPLER;
  }